

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

pair<slang::parsing::Trivia,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handlePragmaDirective
          (pair<slang::parsing::Trivia,_slang::parsing::Trivia> *__return_storage_ptr__,
          Preprocessor *this,Token directive)

{
  Token *pTVar1;
  undefined8 uVar2;
  Info *pIVar3;
  undefined8 uVar4;
  BumpAllocator *this_00;
  Info *pIVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  undefined1 auVar9 [16];
  pair<slang::parsing::Trivia,_slang::parsing::Trivia> *ppVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  SourceLocation SVar15;
  undefined4 extraout_var;
  PragmaDirectiveSyntax *pragma;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX_02;
  EVP_PKEY_CTX *src_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_03;
  Token TVar16;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar17;
  string_view sVar18;
  Trivia TVar19;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  Trivia skippedTrivia;
  SmallVector<slang::parsing::Token,_4UL> skipped;
  Token name;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> args;
  undefined1 local_150 [16];
  __index_type local_140;
  undefined1 local_138 [14];
  undefined2 uStack_12a;
  pair<slang::parsing::Trivia,_slang::parsing::Trivia> *local_128;
  Token local_120;
  SmallVectorBase<slang::parsing::Token> local_110 [2];
  Token local_b8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  local_120.info = directive.info;
  local_120._0_8_ = directive._0_8_;
  if ((this->currentToken).info == (Info *)0x0) {
    TVar16 = nextProcessed(this);
    this->currentToken = TVar16;
  }
  if ((this->currentToken).kind == Identifier) {
    if ((this->currentToken).info == (Info *)0x0) {
      TVar16 = nextProcessed(this);
      this->currentToken = TVar16;
    }
    local_a8[0].data_ = *(pointer *)&this->currentToken;
    local_a8[0].len = (size_type)(this->currentToken).info;
    bVar11 = Token::isOnSameLine((Token *)local_a8);
    if (bVar11) {
      local_a8[0].data_ = (pointer)local_a8[0].firstElement;
      local_a8[0].len = 0;
      local_a8[0].cap = 4;
      local_110[0].data_ = (pointer)local_110[0].firstElement;
      local_110[0].len = 0;
      local_110[0].cap = 4;
      if ((this->currentToken).info == (Info *)0x0) {
        TVar16 = nextProcessed(this);
        this->currentToken = TVar16;
      }
      pTVar1 = &this->currentToken;
      uVar2._0_2_ = (this->currentToken).kind;
      uVar2._2_1_ = (this->currentToken).field_0x2;
      uVar2._3_1_ = (this->currentToken).numFlags.raw;
      uVar2._4_4_ = (this->currentToken).rawLen;
      pIVar3 = (this->currentToken).info;
      uVar6 = pTVar1->field_0x2;
      NVar7.raw = (pTVar1->numFlags).raw;
      uVar8 = pTVar1->rawLen;
      pIVar5 = (this->currentToken).info;
      (this->lastConsumed).kind = pTVar1->kind;
      (this->lastConsumed).field_0x2 = uVar6;
      (this->lastConsumed).numFlags = (NumericTokenFlags)NVar7.raw;
      (this->lastConsumed).rawLen = uVar8;
      (this->lastConsumed).info = pIVar5;
      Token::Token((Token *)local_150);
      auVar9 = local_150;
      pTVar1->kind = local_150._0_2_;
      pTVar1->field_0x2 = local_150[2];
      pTVar1->numFlags = (NumericTokenFlags)local_150[3];
      pTVar1->rawLen = local_150._4_4_;
      (this->currentToken).info = (Info *)local_150._8_8_;
      bVar13 = true;
      bVar11 = false;
      local_150 = auVar9;
      local_128 = __return_storage_ptr__;
      local_b8._0_8_ = uVar2;
      local_b8.info = pIVar3;
      while (bVar12 = peekSameLine(this), src = extraout_RDX, bVar12) {
        if (bVar11) {
          local_150 = (undefined1  [16])expect(this,Comma);
          local_140 = '\0';
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_a8,(TokenOrSyntax *)local_150);
        }
        else {
          pVar17 = parsePragmaExpression(this);
          local_150._0_8_ = pVar17.first;
          local_140 = '\x01';
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_a8,(TokenOrSyntax *)local_150);
          src = extraout_RDX_00;
          if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            while (bVar13 = peekSameLine(this), bVar13) {
              if ((this->currentToken).info == (Info *)0x0) {
                TVar16 = nextProcessed(this);
                this->currentToken = TVar16;
              }
              uVar4._0_2_ = (this->currentToken).kind;
              uVar4._2_1_ = (this->currentToken).field_0x2;
              uVar4._3_1_ = (this->currentToken).numFlags;
              uVar4._4_4_ = (this->currentToken).rawLen;
              pIVar3 = (this->currentToken).info;
              uVar6 = pTVar1->field_0x2;
              NVar7.raw = (pTVar1->numFlags).raw;
              uVar8 = pTVar1->rawLen;
              pIVar5 = (this->currentToken).info;
              (this->lastConsumed).kind = pTVar1->kind;
              (this->lastConsumed).field_0x2 = uVar6;
              (this->lastConsumed).numFlags = (NumericTokenFlags)NVar7.raw;
              (this->lastConsumed).rawLen = uVar8;
              (this->lastConsumed).info = pIVar5;
              Token::Token((Token *)local_150);
              auVar9 = local_150;
              pTVar1->kind = local_150._0_2_;
              pTVar1->field_0x2 = local_150[2];
              pTVar1->numFlags = (NumericTokenFlags)local_150[3];
              pTVar1->rawLen = local_150._4_4_;
              (this->currentToken).info = (Info *)local_150._8_8_;
              local_138._0_6_ = (undefined6)uVar4;
              local_138._6_2_ = (undefined2)((uint)uVar4._4_4_ >> 0x10);
              local_138._8_6_ = SUB86(pIVar3,0);
              uStack_12a = (undefined2)((ulong)pIVar3 >> 0x30);
              local_150 = auVar9;
              SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                        (local_110,(Token *)local_138);
            }
            bVar13 = false;
            src = extraout_RDX_01;
          }
          if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
        }
        bVar11 = (bool)(bVar11 ^ 1);
      }
      this_00 = this->alloc;
      local_150._0_4_ =
           SmallVectorBase<slang::syntax::TokenOrSyntax>::copy(local_a8,(EVP_PKEY_CTX *)this_00,src)
      ;
      local_150._4_4_ = extraout_var;
      local_150._8_8_ = extraout_RDX_02;
      pragma = BumpAllocator::
               emplace<slang::syntax::PragmaDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
                         (this_00,&local_120,&local_b8,
                          (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)local_150);
      ppVar10 = local_128;
      if (bVar13) {
        applyPragma(this,pragma,local_110);
      }
      Trivia::Trivia((Trivia *)local_150);
      if (local_110[0].len != 0) {
        iVar14 = SmallVectorBase<slang::parsing::Token>::copy
                           (local_110,(EVP_PKEY_CTX *)this->alloc,src_00);
        tokens._M_ptr._4_4_ = extraout_var_00;
        tokens._M_ptr._0_4_ = iVar14;
        tokens._M_extent._M_extent_value = extraout_RDX_03._M_extent_value;
        Trivia::Trivia((Trivia *)local_138,SkippedTokens,tokens);
        auVar9 = local_150;
        local_150._6_2_ = local_138._6_2_;
        local_150._0_6_ = local_138._0_6_;
        local_150._14_2_ = auVar9._14_2_;
        local_150._8_8_ =
             (undefined8)
             (CONCAT28(local_150._14_2_,CONCAT62(local_138._8_6_,local_138._6_2_)) >> 0x10);
      }
      Trivia::Trivia((Trivia *)local_138,Directive,(SyntaxNode *)pragma);
      (ppVar10->first).field_0.rawText.ptr = (char *)CONCAT26(local_138._6_2_,local_138._0_6_);
      *(ulong *)((long)&(ppVar10->first).field_0 + 8) = CONCAT26(uStack_12a,local_138._8_6_);
      (ppVar10->second).field_0.rawText.ptr = (char *)local_150._0_8_;
      *(undefined8 *)((long)&(ppVar10->second).field_0 + 8) = local_150._8_8_;
      if (local_110[0].data_ != (pointer)local_110[0].firstElement) {
        operator_delete(local_110[0].data_);
      }
      if (local_a8[0].data_ == (pointer)local_a8[0].firstElement) {
        return ppVar10;
      }
      operator_delete(local_a8[0].data_);
      return ppVar10;
    }
  }
  SVar15 = Token::location(&local_120);
  sVar18 = Token::rawText(&local_120);
  Diagnostics::add(this->diagnostics,(DiagCode)0x90004,
                   (SourceLocation)((long)SVar15 + sVar18._M_len * 0x10000000));
  TVar16.info = local_120.info;
  TVar16.kind = local_120.kind;
  TVar16._2_1_ = local_120._2_1_;
  TVar16.numFlags.raw = local_120.numFlags.raw;
  TVar16.rawLen = local_120.rawLen;
  TVar19 = createSimpleDirective(this,TVar16);
  Trivia::Trivia(&__return_storage_ptr__->second);
  (__return_storage_ptr__->first).field_0.rawText.ptr = TVar19.field_0._0_8_;
  (__return_storage_ptr__->first).hasFullLocation = (bool)(char)TVar19._12_2_;
  (__return_storage_ptr__->first).kind = (char)((ushort)TVar19._12_2_ >> 8);
  (__return_storage_ptr__->first).field_0.rawText.len = TVar19.field_0._8_4_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Trivia, Trivia> Preprocessor::handlePragmaDirective(Token directive) {
    if (peek().kind != TokenKind::Identifier || !peek().isOnSameLine()) {
        addDiag(diag::ExpectedPragmaName, directive.location() + directive.rawText().length());
        return {createSimpleDirective(directive), Trivia()};
    }

    SmallVector<TokenOrSyntax, 4> args;
    SmallVector<Token, 4> skipped;
    Token name = consume();
    bool wantComma = false;
    bool ok = true;

    // This loop needs to be careful not to prematurely peek() and pull a
    // new token from the lexer, since some pragmas may change how we lex
    // tokens on the following line (such as pragma protect encoded blocks).
    while (peekSameLine()) {
        if (wantComma) {
            args.push_back(expect(TokenKind::Comma));
            wantComma = false;
        }
        else {
            auto [expr, succeeded] = parsePragmaExpression();
            args.push_back(expr);
            wantComma = true;

            if (!succeeded) {
                while (peekSameLine())
                    skipped.push_back(consume());

                ok = false;
                break;
            }
        }
    }

    auto result = alloc.emplace<PragmaDirectiveSyntax>(directive, name, args.copy(alloc));
    if (ok)
        applyPragma(*result, skipped);

    Trivia skippedTrivia;
    if (!skipped.empty())
        skippedTrivia = Trivia(TriviaKind::SkippedTokens, skipped.copy(alloc));

    return {Trivia(TriviaKind::Directive, result), skippedTrivia};
}